

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

void __thiscall QGraphicsItemPrivate::setPosHelper(QGraphicsItemPrivate *this,QPointF *pos)

{
  long lVar1;
  QPointF *in_RSI;
  QGraphicsItemPrivate *in_RDI;
  long in_FS_OFFSET;
  qreal qVar2;
  qreal qVar3;
  QGraphicsItem *q;
  QPointF oldPos;
  QGraphicsItem *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  *(ulong *)&in_RDI->field_0x160 = *(ulong *)&in_RDI->field_0x160 & 0xffffffffefffffff | 0x10000000;
  if (in_RDI->scene != (QGraphicsScene *)0x0) {
    QGraphicsItem::prepareGeometryChange(in_stack_ffffffffffffffe8);
  }
  (in_RDI->pos).xp = in_RSI->xp;
  (in_RDI->pos).yp = in_RSI->yp;
  *(ulong *)&in_RDI->field_0x160 =
       *(ulong *)&in_RDI->field_0x160 & 0xffdfffffffffffff | 0x20000000000000;
  *(ulong *)&in_RDI->field_0x160 = *(ulong *)&in_RDI->field_0x160 & 0xffffffffefffffff;
  if ((*(ulong *)&in_RDI->field_0x160 >> 0x38 & 1) != 0) {
    qVar2 = QPointF::x(in_RSI);
    qVar3 = QPointF::x((QPointF *)&stack0xffffffffffffffe8);
    if ((qVar2 != qVar3) || (NAN(qVar2) || NAN(qVar3))) {
      QGraphicsObject::xChanged((QGraphicsObject *)0x97dc4c);
    }
    qVar2 = QPointF::y(in_RSI);
    qVar3 = QPointF::y((QPointF *)&stack0xffffffffffffffe8);
    if ((qVar2 != qVar3) || (NAN(qVar2) || NAN(qVar3))) {
      QGraphicsObject::yChanged((QGraphicsObject *)0x97dcb0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsItemPrivate::setPosHelper(const QPointF &pos)
{
    Q_Q(QGraphicsItem);
    inSetPosHelper = 1;
    if (scene)
        q->prepareGeometryChange();
    QPointF oldPos = this->pos;
    this->pos = pos;
    dirtySceneTransform = 1;
    inSetPosHelper = 0;
    if (isObject) {
        if (pos.x() != oldPos.x())
            emit static_cast<QGraphicsObject *>(q_ptr)->xChanged();
        if (pos.y() != oldPos.y())
            emit static_cast<QGraphicsObject *>(q_ptr)->yChanged();
    }
}